

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::callbackProcessing(FederateState *this)

{
  BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  FederateStates FVar1;
  MessageProcessingResult MVar2;
  bool bVar3;
  mapped_type *pmVar4;
  bool bVar5;
  FederateStates lastState;
  optional<helics::ActionMessage> cmd;
  ActionMessage gError;
  
  if (((this->state)._M_i != FINISHED) &&
     (FVar1 = (this->state)._M_i, ((this->initRequested)._M_base._M_i & 1U) != 0)) {
    while( true ) {
      lastState = (this->state)._M_i;
      MVar2 = processDelayQueue(this);
      if (MVar2 < NEXT_STEP) break;
      callbackReturnResult(this,lastState,MVar2,(this->state)._M_i);
    }
    this_00 = &this->queue;
    gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    try_pop(&cmd,this_00);
    bVar5 = false;
    while (cmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
           super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
           super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
      bVar3 = messageShouldBeDelayed(this,(ActionMessage *)&cmd);
      if (bVar3) {
        pmVar4 = std::
                 map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                 ::operator[](&this->delayQueues,
                              &cmd.super__Optional_base<helics::ActionMessage,_false,_false>.
                               _M_payload.
                               super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                               super__Optional_payload_base<helics::ActionMessage>._M_payload.
                               _M_value.source_id);
        CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar4,
                   (value_type *)&cmd);
        gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
        ::try_pop((optional<helics::ActionMessage> *)&gError,this_00);
        std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                  ((_Optional_payload_base<helics::ActionMessage> *)&cmd,
                   (_Optional_payload_base<helics::ActionMessage> *)&gError);
        std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                  ((_Optional_payload_base<helics::ActionMessage> *)&gError);
      }
      else {
        MVar2 = processActionMessage(this,(ActionMessage *)&cmd);
        if (MVar2 == ERROR_RESULT) {
          bVar3 = (bool)(cmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                         super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                         super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.
                         messageAction == cmd_global_error | bVar5);
          if ((((FVar1 != ERRORED) && ((this->state)._M_i == ERRORED)) &&
              (cmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
               super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
               super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageAction
               != cmd_global_error && !bVar5)) && (this->mParent != (CommonCore *)0x0)) {
            ActionMessage::ActionMessage(&gError,cmd_local_error);
            if (this->terminate_on_error == true) {
              ActionMessage::setAction(&gError,cmd_global_error);
            }
            else {
              TimeCoordinator::localError
                        ((this->timeCoord)._M_t.
                         super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                         .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
            }
            gError.source_id.gid = (this->global_id)._M_i.gid;
            gError.dest_id.gid = 0;
            gError.messageID = this->errorCode;
            SmallBuffer::operator=(&gError.payload,&this->errorString);
            BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&gError);
            ActionMessage::~ActionMessage(&gError);
            bVar3 = false;
          }
        }
        else {
          bVar3 = bVar5;
          if (MVar2 == DELAY_MESSAGE) {
            gError.messageAction =
                 (action_t)
                 cmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                 super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                 super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.source_id.
                 gid;
            pmVar4 = std::
                     map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                     ::operator[](&this->delayQueues,(key_type *)&gError);
            CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
            push_back((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar4
                      ,(value_type *)&cmd);
          }
        }
        bVar5 = bVar3;
        if (FVar1 == ERRORED) {
          MVar2 = ERROR_RESULT;
        }
        if (DELAY_MESSAGE < MVar2) {
          callbackReturnResult(this,lastState,MVar2,(this->state)._M_i);
          lastState = (this->state)._M_i;
        }
        gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
        ::try_pop((optional<helics::ActionMessage> *)&gError,this_00);
        std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                  ((_Optional_payload_base<helics::ActionMessage> *)&cmd,
                   (_Optional_payload_base<helics::ActionMessage> *)&gError);
        std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                  ((_Optional_payload_base<helics::ActionMessage> *)&gError);
      }
    }
    std::_Optional_payload_base<helics::ActionMessage>::_M_reset
              ((_Optional_payload_base<helics::ActionMessage> *)&cmd);
  }
  return;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}